

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

ON_FontGlyph * __thiscall
ON_Font::Internal_ManagedCodePointGlyph
          (ON_Font *this,ON__UINT32 unicode_code_point,bool bCreateIfMissing,bool bFindSubstitutes)

{
  bool bVar1;
  int iVar2;
  uint font_glyph_index;
  ON_FontGlyphCache *pOVar3;
  ON_FontGlyph *pOVar4;
  char *sFormat;
  element_type *this_00;
  undefined4 uVar5;
  undefined4 uVar6;
  ON_TextBox font_unit_glyph_box;
  ON_FontGlyph glyph;
  ON_TextBox local_c8;
  ON_TextBox local_a8;
  ON_FontGlyph local_88;
  
  iVar2 = ON_IsValidUnicodeCodePoint(unicode_code_point);
  if (iVar2 == 0) {
    sFormat = "invalid codepoint parameter.";
    iVar2 = 0x3443;
  }
  else if (this->m_runtime_serial_number == 0) {
    sFormat = "this->IsManagedFont() must be true.";
    iVar2 = 0x3449;
  }
  else {
    this_00 = (ON_GlyphMap *)0x0;
    pOVar3 = FontGlyphCache(this,false);
    if (pOVar3 != (ON_FontGlyphCache *)0x0) {
      this_00 = (pOVar3->m_glyphmap).super___shared_ptr<ON_GlyphMap,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    }
    if (this_00 != (ON_GlyphMap *)0x0) {
      pOVar4 = ON_GlyphMap::FindGlyph(this_00,unicode_code_point);
      if (!bCreateIfMissing || pOVar4 != (ON_FontGlyph *)0x0) {
        return pOVar4;
      }
      local_88.m_font_unit_glyph_bbox.m_bbmin = ON_2dex::Unset;
      local_88.m_font_unit_glyph_bbox.m_bbmax = ON_2dex::Unset;
      local_88.m_font_unit_glyph_bbox.m_max_basepoint = ON_2dex::Zero;
      local_88.m_font_unit_glyph_bbox.m_advance = ON_2dex::Zero;
      local_88.m_normalized_glyph_bbox.m_bbmin = ON_2dex::Unset;
      local_88.m_normalized_glyph_bbox.m_bbmax = ON_2dex::Unset;
      local_88.m_normalized_glyph_bbox.m_max_basepoint = ON_2dex::Zero;
      local_88.m_normalized_glyph_bbox.m_advance = ON_2dex::Zero;
      local_88.m_code_point = 0x110000;
      local_88.m_is_managed = '\0';
      local_88.m_reserved1 = '\0';
      local_88.m_reserved2 = 0;
      local_88.m_reserved3 = 0;
      local_88.m_font_glyph_index = 0;
      local_88.m_managed_font._0_4_ = 0;
      local_88.m_managed_font._4_4_ = 0;
      local_88.m_substitute = (ON_FontGlyph *)0x0;
      ON_FontGlyph::SetCodePoint(&local_88,this,unicode_code_point);
      local_c8.m_max_basepoint = ON_TextBox::Unset.m_max_basepoint;
      local_c8.m_advance = ON_TextBox::Unset.m_advance;
      local_c8.m_bbmin = ON_TextBox::Unset.m_bbmin;
      local_c8.m_bbmax = ON_TextBox::Unset.m_bbmax;
      font_glyph_index =
           ON_ManagedFonts::GetGlyphMetricsInFontDesignUnits(this,unicode_code_point,&local_c8);
      if (font_glyph_index != 0) {
        bVar1 = ON_TextBox::IsSet(&local_c8);
        if (bVar1) {
          local_88.m_font_unit_glyph_bbox.m_max_basepoint = local_c8.m_max_basepoint;
          local_88.m_font_unit_glyph_bbox.m_advance = local_c8.m_advance;
          local_88.m_font_unit_glyph_bbox.m_bbmin = local_c8.m_bbmin;
          local_88.m_font_unit_glyph_bbox.m_bbmax = local_c8.m_bbmax;
          pOVar3 = FontGlyphCache(this,false);
          if (pOVar3 == (ON_FontGlyphCache *)0x0) {
            uVar5 = 0;
            uVar6 = 0x3ff00000;
          }
          else {
            uVar5 = SUB84(pOVar3->m_font_unit_to_normalized_scale,0);
            uVar6 = (undefined4)((ulong)pOVar3->m_font_unit_to_normalized_scale >> 0x20);
          }
          local_a8.m_max_basepoint = local_c8.m_max_basepoint;
          local_a8.m_advance = local_c8.m_advance;
          local_a8.m_bbmin = local_c8.m_bbmin;
          local_a8.m_bbmax = local_c8.m_bbmax;
          if (0.0 <= (double)CONCAT44(uVar6,uVar5) && (double)CONCAT44(uVar6,uVar5) != 0.0) {
            ON_TextBox::Scale(&local_a8,&local_c8,(double)CONCAT44(uVar6,uVar5));
          }
          local_88.m_normalized_glyph_bbox.m_max_basepoint = local_a8.m_max_basepoint;
          local_88.m_normalized_glyph_bbox.m_advance = local_a8.m_advance;
          local_88.m_normalized_glyph_bbox.m_bbmin = local_a8.m_bbmin;
          local_88.m_normalized_glyph_bbox.m_bbmax = local_a8.m_bbmax;
        }
        ON_FontGlyph::Internal_SetFontGlyphIndex(&local_88,font_glyph_index);
      }
      pOVar4 = ON_GlyphMap::InsertGlyph(this_00,&local_88);
      return pOVar4;
    }
    sFormat = "Unable to create ON_FontGlyphCache.";
    iVar2 = 0x3455;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
             ,iVar2,"",sFormat);
  return (ON_FontGlyph *)0x0;
}

Assistant:

const ON_FontGlyph* ON_Font::Internal_ManagedCodePointGlyph(
  ON__UINT32 unicode_code_point,
  bool bCreateIfMissing,
  bool bFindSubstitutes
) const
{
  if ( false == ON_IsValidUnicodeCodePoint(unicode_code_point) )
  {
    // valid UNICODE codepoint values are <= 0x10FFFF
    ON_ERROR("invalid codepoint parameter.");
    return nullptr;
  }

  if (false == IsManagedFont())
  {
    ON_ERROR("this->IsManagedFont() must be true.");
    return nullptr; 
  }
  
  // First see if we already have the glyph in the cache
  ON_FontGlyphCache* font_cache = FontGlyphCache(true);
  ON_GlyphMap* glyph_map
    = (nullptr == font_cache)
    ? nullptr
    : font_cache->m_glyphmap.get();
  if (nullptr == glyph_map)
  {
    ON_ERROR("Unable to create ON_FontGlyphCache.");
    return nullptr;
  }

  const ON_FontGlyph* managed_glyph = glyph_map->FindGlyph(unicode_code_point);
  if (nullptr != managed_glyph)
    return managed_glyph;

  if (false == bCreateIfMissing)
    return nullptr;

  ON_FontGlyph glyph;
  glyph.SetCodePoint(this, unicode_code_point);

  // Call external function to get glyph details
  ON_TextBox font_unit_glyph_box = ON_TextBox::Unset;
  const unsigned int font_glyph_index = ON_ManagedFonts::GetGlyphMetricsInFontDesignUnits(this, unicode_code_point, font_unit_glyph_box);
  if (0 != font_glyph_index)
  {
    if (font_unit_glyph_box.IsSet())
    {
      glyph.m_font_unit_glyph_bbox = font_unit_glyph_box;
      // Save a normalized box as well.
      const double normalize_scale = this->FontUnitToNormalizedScale();
      ON_TextBox normalized_glyph_box = font_unit_glyph_box;
      if (normalize_scale > 0.0)
        normalized_glyph_box = ON_TextBox::Scale(font_unit_glyph_box, normalize_scale);
      glyph.m_normalized_glyph_bbox = normalized_glyph_box;
    }
    glyph.Internal_SetFontGlyphIndex(font_glyph_index);
    bFindSubstitutes = false;
  }


  return glyph_map->InsertGlyph(glyph);
}